

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void dump_stats(string *stats_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *foz_paths)

{
  pointer pbVar1;
  undefined6 uVar2;
  bool bVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  pointer foz_path;
  Value v;
  Data local_108;
  undefined8 *local_f8;
  undefined8 *puStack_f0;
  Stack<rapidjson::CrtAllocator> local_e8;
  undefined4 local_b8;
  undefined8 local_b0;
  Data local_a8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_90;
  Stack<rapidjson::CrtAllocator> local_88;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88.stack_ = (char *)0x0;
  local_88.stackTop_ = (char *)0x0;
  local_88.allocator_ = (CrtAllocator *)0x0;
  local_88.ownAllocator_ = (CrtAllocator *)0x0;
  local_98 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_90 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_a8.n = (Number)0x0;
  local_a8.s.str = (Ch *)0x0;
  local_88.stackEnd_ = (char *)0x0;
  local_88.initialCapacity_ = 0x400;
  local_58 = 0;
  local_50 = 0;
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  allocator->chunkHead_ = (ChunkHeader *)0x0;
  allocator->chunk_capacity_ = 0x10000;
  allocator->userBuffer_ = (void *)0x0;
  allocator->baseAllocator_ = (CrtAllocator *)0x0;
  allocator->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_a8.n = (Number)0x0;
  local_a8._8_6_ = 0;
  uVar2 = local_a8._8_6_;
  local_a8._8_6_ = 0;
  local_a8.f.flags = 4;
  foz_path = (foz_paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (foz_paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_98 = allocator;
  pMStack_90 = allocator;
  if (foz_path != pbVar1) {
    do {
      local_e8.stack_ = (char *)0x0;
      local_e8.stackTop_ = (char *)0x0;
      local_e8.allocator_ = (CrtAllocator *)0x0;
      local_e8.ownAllocator_ = (CrtAllocator *)0x0;
      local_f8 = (undefined8 *)0x0;
      puStack_f0 = (undefined8 *)0x0;
      local_108.n.i64 = (Number)0x0;
      local_108.s.str = (Ch *)0x0;
      local_e8.stackEnd_ = (char *)0x0;
      local_e8.initialCapacity_ = 0x400;
      local_b8 = 0;
      local_b0 = 0;
      local_f8 = (undefined8 *)operator_new(0x28);
      *local_f8 = 0;
      local_f8[1] = 0x10000;
      local_f8[2] = 0;
      local_f8[3] = 0;
      local_f8[4] = 0;
      puStack_f0 = local_f8;
      bVar3 = parse_json_stats(foz_path,(Document *)&local_108.s);
      if (bVar3) {
        if ((local_a8.f.flags != 4) || (local_108.f.flags != 4)) {
          __assert_fail("IsArray()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x66a,
                        "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::Reserve((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,local_108.s.length + local_a8.s.length,allocator);
        if (local_108.f.flags != 4) {
          __assert_fail("IsArray()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x68c,
                        "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((ulong)local_108.s.str & 0xffffffffffff);
        while (rhs != (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)(((ulong)local_108.n & 0xffffffff) * 0x10 +
                         ((ulong)local_108.s.str & 0xffffffffffff))) {
          local_48 = 0;
          uStack_40 = 0;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)&local_48,rhs,allocator,false);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_a8.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_48,allocator);
          rhs = rhs + 1;
          if (local_108.f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x68f,
                          "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::End() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
        }
        remove((foz_path->_M_dataplus)._M_p);
      }
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 *)&local_108.s);
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_e8);
      foz_path = foz_path + 1;
      uVar2 = local_a8._8_6_;
    } while (foz_path != pbVar1);
  }
  local_a8._8_6_ = uVar2;
  stats_to_csv(stats_path,(Document *)&local_a8.s);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_a8.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_88);
  return;
}

Assistant:

static void dump_stats(const std::string &stats_path, const std::vector<std::string> &foz_paths)
{
	rapidjson::Document doc;
	doc.SetArray();
	auto &alloc = doc.GetAllocator();

	for (auto &sp : foz_paths)
	{
		rapidjson::Document tmp_doc;
		if (!parse_json_stats(sp, tmp_doc))
			continue;

		doc.Reserve(doc.Size() + tmp_doc.Size(), alloc);
		for (auto itr = tmp_doc.Begin(); itr != tmp_doc.End(); itr++)
		{
			rapidjson::Value v;
			v.CopyFrom(*itr, alloc);
			doc.PushBack(v, alloc);
		}
		remove(sp.c_str());
	}

	stats_to_csv(stats_path, doc);
}